

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::SetImportLinkInterface
          (cmExportFileGenerator *this,string *config,string *suffix,
          PreprocessContext preprocessRule,cmGeneratorTarget *target,ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PolicyStatus PVar2;
  cmLinkInterface *entries;
  char *__s;
  size_t sVar3;
  mapped_type *pmVar4;
  cmLocalGenerator *this_00;
  string *psVar5;
  ostream *poVar6;
  bool bVar7;
  string prepro;
  string local_1d0;
  ImportPropertyMap *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = properties;
  entries = cmGeneratorTarget::GetLinkInterface(target,config,target);
  if (entries == (cmLinkInterface *)0x0) {
    return;
  }
  if (entries->ImplementationIsInterface == true) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"IMPORTED_LINK_INTERFACE_LIBRARIES","");
    SetImportLinkProperty<cmLinkItem>
              (this,suffix,target,(string *)local_1a8,
               (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)entries,local_1b0,missingTargets);
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
      return;
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "LINK_INTERFACE_LIBRARIES",suffix);
    __s = cmGeneratorTarget::GetProperty
                    (target,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (__s == (char *)0x0) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"LINK_INTERFACE_LIBRARIES","");
      __s = cmGeneratorTarget::GetProperty(target,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      bVar7 = __s != (char *)0x0;
    }
    else {
      bVar7 = true;
    }
    if (!bVar7) {
      return;
    }
    PVar2 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
    if (((PVar2 != WARN) &&
        (PVar2 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022), PVar2 != OLD)) &&
       (this->ExportOld == false)) {
      this_00 = cmGeneratorTarget::GetLocalGenerator(target);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 "\" has policy CMP0022 enabled, but also has old-style LINK_INTERFACE_LIBRARIES properties populated, but it was exported without the EXPORT_LINK_INTERFACE_LIBRARIES to export the old-style properties"
                 ,0xc6);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return;
    }
    if (*__s == '\0') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "IMPORTED_LINK_INTERFACE_LIBRARIES",suffix);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_1b0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1a8);
      pmVar4->_M_string_length = 0;
      *(pmVar4->_M_dataplus)._M_p = '\0';
    }
    else {
      paVar1 = &local_1d0.field_2;
      local_1d0._M_dataplus._M_p = (pointer)paVar1;
      sVar3 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,__s,__s + sVar3);
      cmGeneratorExpression::Preprocess((string *)local_1a8,&local_1d0,preprocessRule,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8._8_8_ != 0) {
        ResolveTargetsInGeneratorExpressions
                  (this,(string *)local_1a8,target,missingTargets,ReplaceFreeTargets);
        std::operator+(&local_1d0,"IMPORTED_LINK_INTERFACE_LIBRARIES",suffix);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_1b0,&local_1d0);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
      return;
    }
  }
  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  return;
}

Assistant:

void cmExportFileGenerator::SetImportLinkInterface(
  const std::string& config, std::string const& suffix,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::vector<std::string>& missingTargets)
{
  // Add the transitive link dependencies for this configuration.
  cmLinkInterface const* iface = target->GetLinkInterface(config, target);
  if (!iface) {
    return;
  }

  if (iface->ImplementationIsInterface) {
    // Policy CMP0022 must not be NEW.
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_INTERFACE_LIBRARIES",
                                iface->Libraries, properties, missingTargets);
    return;
  }

  const char* propContent;

  if (const char* prop_suffixed =
        target->GetProperty("LINK_INTERFACE_LIBRARIES" + suffix)) {
    propContent = prop_suffixed;
  } else if (const char* prop =
               target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    propContent = prop;
  } else {
    return;
  }

  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;

  if (newCMP0022Behavior && !this->ExportOld) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" has policy CMP0022 enabled, "
         "but also has old-style LINK_INTERFACE_LIBRARIES properties "
         "populated, but it was exported without the "
         "EXPORT_LINK_INTERFACE_LIBRARIES to export the old-style properties";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!*propContent) {
    properties["IMPORTED_LINK_INTERFACE_LIBRARIES" + suffix].clear();
    return;
  }

  std::string prepro =
    cmGeneratorExpression::Preprocess(propContent, preprocessRule);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target, missingTargets,
                                               ReplaceFreeTargets);
    properties["IMPORTED_LINK_INTERFACE_LIBRARIES" + suffix] = prepro;
  }
}